

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<8U>::
impl<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies,_boost::mpl::vector9<unsigned_char,_StimulationCommand_&,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short>_>
::operator()(impl<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies,_boost::mpl::vector9<unsigned_char,_StimulationCommand_&,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  PyObject *pPVar3;
  undefined1 local_111;
  c_t0 c0;
  c_t7 c7;
  c_t6 c6;
  c_t5 c5;
  c_t4 c4;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  
  c0.super_type.super_arg_lvalue_from_python_base.m_result =
       (type)converter::get_lvalue_from_python
                       ((_object *)args_[1].ob_type,
                        converter::detail::registered_base<StimulationCommand_const_volatile&>::
                        converters);
  if (c0.super_type.super_arg_lvalue_from_python_base.m_result != (arg_lvalue_from_python_base)0x0)
  {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    c1.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1 =
         (rvalue_from_python_stage1_data)
         converter::rvalue_from_python_stage1
                   (p_Var1,converter::detail::registered_base<unsigned_short_const_volatile&>::
                           converters);
    if (c1.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1.convertible
        != (void *)0x0) {
      pPVar2 = args_[2].ob_type;
      c1.super_type.m_source = p_Var1;
      c2.super_type.m_data.super_rvalue_from_python_storage<unsigned_char_&>.stage1 =
           (rvalue_from_python_stage1_data)
           converter::rvalue_from_python_stage1
                     ((_object *)pPVar2,
                      converter::detail::registered_base<unsigned_char_const_volatile&>::converters)
      ;
      if (c2.super_type.m_data.super_rvalue_from_python_storage<unsigned_char_&>.stage1.convertible
          != (void *)0x0) {
        p_Var1 = (_object *)args_[3].ob_refcnt;
        c2.super_type.m_source = (PyObject *)pPVar2;
        c3.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1 =
             (rvalue_from_python_stage1_data)
             converter::rvalue_from_python_stage1
                       (p_Var1,converter::detail::registered_base<unsigned_short_const_volatile&>::
                               converters);
        if (c3.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1.
            convertible != (void *)0x0) {
          pPVar2 = args_[3].ob_type;
          c3.super_type.m_source = p_Var1;
          c4.super_type.m_data.super_rvalue_from_python_storage<unsigned_char_&>.stage1 =
               (rvalue_from_python_stage1_data)
               converter::rvalue_from_python_stage1
                         ((_object *)pPVar2,
                          converter::detail::registered_base<unsigned_char_const_volatile&>::
                          converters);
          if (c4.super_type.m_data.super_rvalue_from_python_storage<unsigned_char_&>.stage1.
              convertible != (void *)0x0) {
            p_Var1 = (_object *)args_[4].ob_refcnt;
            c4.super_type.m_source = (PyObject *)pPVar2;
            c5.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1 =
                 (rvalue_from_python_stage1_data)
                 converter::rvalue_from_python_stage1
                           (p_Var1,converter::detail::
                                   registered_base<unsigned_short_const_volatile&>::converters);
            if (c5.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1.
                convertible != (void *)0x0) {
              pPVar2 = args_[4].ob_type;
              c5.super_type.m_source = p_Var1;
              c6.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1 =
                   (rvalue_from_python_stage1_data)
                   converter::rvalue_from_python_stage1
                             ((_object *)pPVar2,
                              converter::detail::registered_base<unsigned_short_const_volatile&>::
                              converters);
              if (c6.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1.
                  convertible != (void *)0x0) {
                p_Var1 = (_object *)args_[5].ob_refcnt;
                c6.super_type.m_source = (PyObject *)pPVar2;
                c7.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1 =
                     (rvalue_from_python_stage1_data)
                     converter::rvalue_from_python_stage1
                               (p_Var1,converter::detail::
                                       registered_base<unsigned_short_const_volatile&>::converters);
                if (c7.super_type.m_data.super_rvalue_from_python_storage<unsigned_short_&>.stage1.
                    convertible != (void *)0x0) {
                  c7.super_type.m_source = p_Var1;
                  pPVar3 = invoke<boost::python::to_python_value<unsigned_char_const&>,unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short),boost::python::arg_from_python<StimulationCommand&>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_char>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_char>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_short>>
                                     (&local_111,this,&c0,&c1,&c2,&c3,&c4,&c5,&c6,&c7);
                  return pPVar3;
                }
              }
            }
          }
        }
      }
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }